

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobCacheEntry.h
# Opt level: O1

void __thiscall
cmGlobCacheEntry::cmGlobCacheEntry
          (cmGlobCacheEntry *this,bool recurse,bool listDirectories,bool followSymlinks,
          string *relative,string *expression,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  this->Recurse = recurse;
  this->ListDirectories = listDirectories;
  this->FollowSymlinks = followSymlinks;
  paVar1 = &(this->Relative).field_2;
  (this->Relative)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (relative->_M_dataplus)._M_p;
  paVar2 = &relative->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&relative->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Relative).field_2 + 8) = uVar4;
  }
  else {
    (this->Relative)._M_dataplus._M_p = pcVar3;
    (this->Relative).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->Relative)._M_string_length = relative->_M_string_length;
  (relative->_M_dataplus)._M_p = (pointer)paVar2;
  relative->_M_string_length = 0;
  (relative->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->Expression).field_2;
  (this->Expression)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (expression->_M_dataplus)._M_p;
  paVar2 = &expression->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&expression->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Expression).field_2 + 8) = uVar4;
  }
  else {
    (this->Expression)._M_dataplus._M_p = pcVar3;
    (this->Expression).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->Expression)._M_string_length = expression->_M_string_length;
  (expression->_M_dataplus)._M_p = (pointer)paVar2;
  expression->_M_string_length = 0;
  (expression->field_2)._M_local_buf[0] = '\0';
  (this->Files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (files->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->Files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (files->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->Files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (files->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (files->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (files->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (files->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

cmGlobCacheEntry(bool recurse, bool listDirectories, bool followSymlinks,
                   std::string relative, std::string expression,
                   std::vector<std::string> files)
    : Recurse(recurse)
    , ListDirectories(listDirectories)
    , FollowSymlinks(followSymlinks)
    , Relative(std::move(relative))
    , Expression(std::move(expression))
    , Files(std::move(files))
  {
  }